

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticModelTester.h
# Opt level: O0

void __thiscall
psy::C::SemanticModelTester::SemanticModelTester(SemanticModelTester *this,TestSuite *suite)

{
  initializer_list<std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>_>
  __l;
  _Any_data *local_43f8;
  allocator<std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>_>
  local_43c1;
  char *local_43c0;
  code *local_43b8;
  undefined8 local_43b0;
  char *local_43a8;
  code *local_43a0;
  undefined8 local_4398;
  char *local_4390;
  code *local_4388;
  undefined8 local_4380;
  char *local_4378;
  code *local_4370;
  undefined8 local_4368;
  char *local_4360;
  code *local_4358;
  undefined8 local_4350;
  char *local_4348;
  code *local_4340;
  undefined8 local_4338;
  char *local_4330;
  code *local_4328;
  undefined8 local_4320;
  char *local_4318;
  code *local_4310;
  undefined8 local_4308;
  char *local_4300;
  code *local_42f8;
  undefined8 local_42f0;
  char *local_42e8;
  code *local_42e0;
  undefined8 local_42d8;
  char *local_42d0;
  code *local_42c8;
  undefined8 local_42c0;
  char *local_42b8;
  code *local_42b0;
  undefined8 local_42a8;
  char *local_42a0;
  code *local_4298;
  undefined8 local_4290;
  char *local_4288;
  code *local_4280;
  undefined8 local_4278;
  char *local_4270;
  code *local_4268;
  undefined8 local_4260;
  char *local_4258;
  code *local_4250;
  undefined8 local_4248;
  char *local_4240;
  code *local_4238;
  undefined8 local_4230;
  char *local_4228;
  code *local_4220;
  undefined8 local_4218;
  char *local_4210;
  code *local_4208;
  undefined8 local_4200;
  char *local_41f8;
  code *local_41f0;
  undefined8 local_41e8;
  char *local_41e0;
  code *local_41d8;
  undefined8 local_41d0;
  char *local_41c8;
  code *local_41c0;
  undefined8 local_41b8;
  char *local_41b0;
  code *local_41a8;
  undefined8 local_41a0;
  char *local_4198;
  code *local_4190;
  undefined8 local_4188;
  char *local_4180;
  code *local_4178;
  undefined8 local_4170;
  char *local_4168;
  code *local_4160;
  undefined8 local_4158;
  char *local_4150;
  code *local_4148;
  undefined8 local_4140;
  char *local_4138;
  code *local_4130;
  undefined8 local_4128;
  char *local_4120;
  code *local_4118;
  undefined8 local_4110;
  char *local_4108;
  code *local_4100;
  undefined8 local_40f8;
  char *local_40f0;
  code *local_40e8;
  undefined8 local_40e0;
  char *local_40d8;
  code *local_40d0;
  undefined8 local_40c8;
  char *local_40c0;
  code *local_40b8;
  undefined8 local_40b0;
  char *local_40a8;
  code *local_40a0;
  undefined8 local_4098;
  char *local_4090;
  code *local_4088;
  undefined8 local_4080;
  char *local_4078;
  code *local_4070;
  undefined8 local_4068;
  char *local_4060;
  code *local_4058;
  undefined8 local_4050;
  char *local_4048;
  code *local_4040;
  undefined8 local_4038;
  char *local_4030;
  code *local_4028;
  undefined8 local_4020;
  char *local_4018;
  code *local_4010;
  undefined8 local_4008;
  char *local_4000;
  code *local_3ff8;
  undefined8 local_3ff0;
  char *local_3fe8;
  code *local_3fe0;
  undefined8 local_3fd8;
  char *local_3fd0;
  code *local_3fc8;
  undefined8 local_3fc0;
  char *local_3fb8;
  code *local_3fb0;
  undefined8 local_3fa8;
  char *local_3fa0;
  code *local_3f98;
  undefined8 local_3f90;
  char *local_3f88;
  code *local_3f80;
  undefined8 local_3f78;
  char *local_3f70;
  code *local_3f68;
  undefined8 local_3f60;
  char *local_3f58;
  code *local_3f50;
  undefined8 local_3f48;
  char *local_3f40;
  code *local_3f38;
  undefined8 local_3f30;
  char *local_3f28;
  code *local_3f20;
  undefined8 local_3f18;
  char *local_3f10;
  code *local_3f08;
  undefined8 local_3f00;
  char *local_3ef8;
  code *local_3ef0;
  undefined8 local_3ee8;
  char *local_3ee0;
  code *local_3ed8;
  undefined8 local_3ed0;
  char *local_3ec8;
  code *local_3ec0;
  undefined8 local_3eb8;
  char *local_3eb0;
  code *local_3ea8;
  undefined8 local_3ea0;
  char *local_3e98;
  code *local_3e90;
  undefined8 local_3e88;
  char *local_3e80;
  code *local_3e78;
  undefined8 local_3e70;
  char *local_3e68;
  code *local_3e60;
  undefined8 local_3e58;
  char *local_3e50;
  code *local_3e48;
  undefined8 local_3e40;
  char *local_3e38;
  code *local_3e30;
  undefined8 local_3e28;
  char *local_3e20;
  code *local_3e18;
  undefined8 local_3e10;
  char *local_3e08;
  code *local_3e00;
  undefined8 local_3df8;
  char *local_3df0;
  code *local_3de8;
  undefined8 local_3de0;
  char *local_3dd8;
  code *local_3dd0;
  undefined8 local_3dc8;
  char *local_3dc0;
  code *local_3db8;
  undefined8 local_3db0;
  char *local_3da8;
  code *local_3da0;
  undefined8 local_3d98;
  char *local_3d90;
  code *local_3d88;
  undefined8 local_3d80;
  char *local_3d78;
  code *local_3d70;
  undefined8 local_3d68;
  char *local_3d60;
  code *local_3d58;
  undefined8 local_3d50;
  char *local_3d48;
  code *local_3d40;
  undefined8 local_3d38;
  char *local_3d30;
  code *local_3d28;
  undefined8 local_3d20;
  char *local_3d18;
  code *local_3d10;
  undefined8 local_3d08;
  char *local_3d00;
  code *local_3cf8;
  undefined8 local_3cf0;
  char *local_3ce8;
  code *local_3ce0;
  undefined8 local_3cd8;
  char *local_3cd0;
  code *local_3cc8;
  undefined8 local_3cc0;
  char *local_3cb8;
  code *local_3cb0;
  undefined8 local_3ca8;
  char *local_3ca0;
  code *local_3c98;
  undefined8 local_3c90;
  char *local_3c88;
  code *local_3c80;
  undefined8 local_3c78;
  char *local_3c70;
  code *local_3c68;
  undefined8 local_3c60;
  char *local_3c58;
  code *local_3c50;
  undefined8 local_3c48;
  char *local_3c40;
  code *local_3c38;
  undefined8 local_3c30;
  char *local_3c28;
  code *local_3c20;
  undefined8 local_3c18;
  char *local_3c10;
  code *local_3c08;
  undefined8 local_3c00;
  char *local_3bf8;
  code *local_3bf0;
  undefined8 local_3be8;
  char *local_3be0;
  code *local_3bd8;
  undefined8 local_3bd0;
  char *local_3bc8;
  code *local_3bc0;
  undefined8 local_3bb8;
  char *local_3bb0;
  code *local_3ba8;
  undefined8 local_3ba0;
  char *local_3b98;
  code *local_3b90;
  undefined8 local_3b88;
  char *local_3b80;
  code *local_3b78;
  undefined8 local_3b70;
  char *local_3b68;
  code *local_3b60;
  undefined8 local_3b58;
  char *local_3b50;
  code *local_3b48;
  undefined8 local_3b40;
  char *local_3b38;
  code *local_3b30;
  undefined8 local_3b28;
  char *local_3b20;
  code *local_3b18;
  undefined8 local_3b10;
  char *local_3b08;
  code *local_3b00;
  undefined8 local_3af8;
  char *local_3af0;
  code *local_3ae8;
  undefined8 local_3ae0;
  char *local_3ad8;
  code *local_3ad0;
  undefined8 local_3ac8;
  char *local_3ac0;
  code *local_3ab8;
  undefined8 local_3ab0;
  char *local_3aa8;
  code *local_3aa0;
  undefined8 local_3a98;
  char *local_3a90;
  code *local_3a88;
  undefined8 local_3a80;
  char *local_3a78;
  code *local_3a70;
  undefined8 local_3a68;
  char *local_3a60;
  code *local_3a58;
  undefined8 local_3a50;
  char *local_3a48;
  code *local_3a40;
  undefined8 local_3a38;
  char *local_3a30;
  code *local_3a28;
  undefined8 local_3a20;
  char *local_3a18;
  code *local_3a10;
  undefined8 local_3a08;
  char *local_3a00;
  code *local_39f8;
  undefined8 local_39f0;
  char *local_39e8;
  code *local_39e0;
  undefined8 local_39d8;
  char *local_39d0;
  code *local_39c8;
  undefined8 local_39c0;
  char *local_39b8;
  code *local_39b0;
  undefined8 local_39a8;
  char *local_39a0;
  code *local_3998;
  undefined8 local_3990;
  char *local_3988;
  code *local_3980;
  undefined8 local_3978;
  char *local_3970;
  code *local_3968;
  undefined8 local_3960;
  char *local_3958;
  code *local_3950;
  undefined8 local_3948;
  char *local_3940;
  code *local_3938;
  undefined8 local_3930;
  char *local_3928;
  code *local_3920;
  undefined8 local_3918;
  char *local_3910;
  code *local_3908;
  undefined8 local_3900;
  char *local_38f8;
  code *local_38f0;
  undefined8 local_38e8;
  char *local_38e0;
  code *local_38d8;
  undefined8 local_38d0;
  char *local_38c8;
  code *local_38c0;
  undefined8 local_38b8;
  char *local_38b0;
  code *local_38a8;
  undefined8 local_38a0;
  char *local_3898;
  code *local_3890;
  undefined8 local_3888;
  char *local_3880;
  code *local_3878;
  undefined8 local_3870;
  char *local_3868;
  code *local_3860;
  undefined8 local_3858;
  char *local_3850;
  code *local_3848;
  undefined8 local_3840;
  char *local_3838;
  code *local_3830;
  undefined8 local_3828;
  char *local_3820;
  code *local_3818;
  undefined8 local_3810;
  char *local_3808;
  code *local_3800;
  undefined8 local_37f8;
  char *local_37f0;
  code *local_37e8;
  undefined8 local_37e0;
  char *local_37d8;
  code *local_37d0;
  undefined8 local_37c8;
  char *local_37c0;
  code *local_37b8;
  undefined8 local_37b0;
  char *local_37a8;
  code *local_37a0;
  undefined8 local_3798;
  char *local_3790;
  code *local_3788;
  undefined8 local_3780;
  char *local_3778;
  code *local_3770;
  undefined8 local_3768;
  char *local_3760;
  code *local_3758;
  undefined8 local_3750;
  char *local_3748;
  code *local_3740;
  undefined8 local_3738;
  char *local_3730;
  code *local_3728;
  undefined8 local_3720;
  char *local_3718;
  code *local_3710;
  undefined8 local_3708;
  char *local_3700;
  code *local_36f8;
  undefined8 local_36f0;
  char *local_36e8;
  code *local_36e0;
  undefined8 local_36d8;
  char *local_36d0;
  code *local_36c8;
  undefined8 local_36c0;
  char *local_36b8;
  code *local_36b0;
  undefined8 local_36a8;
  char *local_36a0;
  code *local_3698;
  undefined8 local_3690;
  char *local_3688;
  code *local_3680;
  undefined8 local_3678;
  char *local_3670;
  code *local_3668;
  undefined8 local_3660;
  char *local_3658;
  code *local_3650;
  undefined8 local_3648;
  char *local_3640;
  code *local_3638;
  undefined8 local_3630;
  char *local_3628;
  code *local_3620;
  undefined8 local_3618;
  char *local_3610;
  code *local_3608;
  undefined8 local_3600;
  char *local_35f8;
  code *local_35f0;
  undefined8 local_35e8;
  char *local_35e0;
  code *local_35d8;
  undefined8 local_35d0;
  char *local_35c8;
  code *local_35c0;
  undefined8 local_35b8;
  char *local_35b0;
  code *local_35a8;
  undefined8 local_35a0;
  char *local_3598;
  code *local_3590;
  undefined8 local_3588;
  char *local_3580;
  code *local_3578;
  undefined8 local_3570;
  char *local_3568;
  code *local_3560;
  undefined8 local_3558;
  char *local_3550;
  code *local_3548;
  undefined8 local_3540;
  char *local_3538;
  code *local_3530;
  undefined8 local_3528;
  char *local_3520;
  code *local_3518;
  undefined8 local_3510;
  char *local_3508;
  code *local_3500;
  undefined8 local_34f8;
  char *local_34f0;
  code *local_34e8;
  undefined8 local_34e0;
  char *local_34d8;
  code *local_34d0;
  undefined8 local_34c8;
  char *local_34c0;
  code *local_34b8;
  undefined8 local_34b0;
  char *local_34a8;
  code *local_34a0;
  undefined8 local_3498;
  char *local_3490;
  code *local_3488;
  undefined8 local_3480;
  char *local_3478;
  code *local_3470;
  undefined8 local_3468;
  char *local_3460;
  code *local_3458;
  undefined8 local_3450;
  char *local_3448;
  code *local_3440;
  undefined8 local_3438;
  char *local_3430;
  code *local_3428;
  undefined8 local_3420;
  char *local_3418;
  code *local_3410;
  undefined8 local_3408;
  char *local_3400;
  code *local_33f8;
  undefined8 local_33f0;
  char *local_33e8;
  code *local_33e0;
  undefined8 local_33d8;
  char *local_33d0;
  code *local_33c8;
  undefined8 local_33c0;
  char *local_33b8;
  code *local_33b0;
  undefined8 local_33a8;
  char *local_33a0;
  code *local_3398;
  undefined8 local_3390;
  char *local_3388;
  code *local_3380;
  undefined8 local_3378;
  char *local_3370;
  code *local_3368;
  undefined8 local_3360;
  char *local_3358;
  code *local_3350;
  undefined8 local_3348;
  char *local_3340;
  code *local_3338;
  undefined8 local_3330;
  char *local_3328;
  code *local_3320;
  undefined8 local_3318;
  char *local_3310;
  code *local_3308;
  undefined8 local_3300;
  char *local_32f8;
  code *local_32f0;
  undefined8 local_32e8;
  char *local_32e0;
  code *local_32d8;
  undefined8 local_32d0;
  char *local_32c8;
  code *local_32c0;
  undefined8 local_32b8;
  char *local_32b0;
  code *local_32a8;
  undefined8 local_32a0;
  char *local_3298;
  code *local_3290;
  undefined8 local_3288;
  char *local_3280;
  code *local_3278;
  undefined8 local_3270;
  char *local_3268;
  code *local_3260;
  undefined8 local_3258;
  char *local_3250;
  code *local_3248;
  undefined8 local_3240;
  char *local_3238;
  code *local_3230;
  undefined8 local_3228;
  char *local_3220;
  code *local_3218;
  undefined8 local_3210;
  char *local_3208;
  code *local_3200;
  undefined8 local_31f8;
  char *local_31f0;
  code *local_31e8;
  undefined8 local_31e0;
  char *local_31d8;
  code *local_31d0;
  undefined8 local_31c8;
  char *local_31c0;
  code *local_31b8;
  undefined8 local_31b0;
  char *local_31a8;
  code *local_31a0;
  undefined8 local_3198;
  char *local_3190;
  code *local_3188;
  undefined8 local_3180;
  char *local_3178;
  code *local_3170;
  undefined8 local_3168;
  char *local_3160;
  code *local_3158;
  undefined8 local_3150;
  char *local_3148;
  code *local_3140;
  undefined8 local_3138;
  char *local_3130;
  code *local_3128;
  undefined8 local_3120;
  char *local_3118;
  code *local_3110;
  undefined8 local_3108;
  char *local_3100;
  code *local_30f8;
  undefined8 local_30f0;
  char *local_30e8;
  code *local_30e0;
  undefined8 local_30d8;
  char *local_30d0;
  code *local_30c8;
  undefined8 local_30c0;
  char *local_30b8;
  code *local_30b0;
  undefined8 local_30a8;
  char *local_30a0;
  code *local_3098;
  undefined8 local_3090;
  char *local_3088;
  code *local_3080;
  undefined8 local_3078;
  char *local_3070;
  code *local_3068;
  undefined8 local_3060;
  char *local_3058;
  code *local_3050;
  undefined8 local_3048;
  char *local_3040;
  code *local_3038;
  undefined8 local_3030;
  char *local_3028;
  code *local_3020;
  undefined8 local_3018;
  char *local_3010;
  code *local_3008;
  undefined8 local_3000;
  char *local_2ff8;
  code *local_2ff0;
  undefined8 local_2fe8;
  char *local_2fe0;
  code *local_2fd8;
  undefined8 local_2fd0;
  char *local_2fc8;
  code *local_2fc0;
  undefined8 local_2fb8;
  char *local_2fb0;
  code *local_2fa8;
  undefined8 local_2fa0;
  char *local_2f98;
  code *local_2f90;
  undefined8 local_2f88;
  char *local_2f80;
  code *local_2f78;
  undefined8 local_2f70;
  char *local_2f68;
  code *local_2f60;
  undefined8 local_2f58;
  char *local_2f50;
  code *local_2f48;
  undefined8 local_2f40;
  char *local_2f38;
  code *local_2f30;
  undefined8 local_2f28;
  char *local_2f20;
  code *local_2f18;
  undefined8 local_2f10;
  char *local_2f08;
  code *local_2f00;
  undefined8 local_2ef8;
  char *local_2ef0;
  code *local_2ee8;
  undefined8 local_2ee0;
  char *local_2ed8;
  code *local_2ed0;
  undefined8 local_2ec8;
  char *local_2ec0;
  code *local_2eb8;
  undefined8 local_2eb0;
  char *local_2ea8;
  code *local_2ea0;
  undefined8 local_2e98;
  char *local_2e90;
  code *local_2e88;
  undefined8 local_2e80;
  char *local_2e78;
  code *local_2e70;
  undefined8 local_2e68;
  char *local_2e60;
  code *local_2e58;
  undefined8 local_2e50;
  char *local_2e48;
  code *local_2e40;
  undefined8 local_2e38;
  char *local_2e30;
  code *local_2e28;
  undefined8 local_2e20;
  char *local_2e18;
  code *local_2e10;
  undefined8 local_2e08;
  char *local_2e00;
  code *local_2df8;
  undefined8 local_2df0;
  char *local_2de8;
  code *local_2de0;
  undefined8 local_2dd8;
  char *local_2dd0;
  code *local_2dc8;
  undefined8 local_2dc0;
  char *local_2db8;
  code *local_2db0;
  undefined8 local_2da8;
  char *local_2da0;
  code *local_2d98;
  undefined8 local_2d90;
  char *local_2d88;
  code *local_2d80;
  undefined8 local_2d78;
  char *local_2d70;
  code *local_2d68;
  undefined8 local_2d60;
  char *local_2d58;
  code *local_2d50;
  undefined8 local_2d48;
  char *local_2d40;
  code *local_2d38;
  undefined8 local_2d30;
  char *local_2d28;
  code *local_2d20;
  undefined8 local_2d18;
  char *local_2d10;
  code *local_2d08;
  undefined8 local_2d00;
  char *local_2cf8;
  code *local_2cf0;
  undefined8 local_2ce8;
  char *local_2ce0;
  code *local_2cd8;
  undefined8 local_2cd0;
  char *local_2cc8;
  code *local_2cc0;
  undefined8 local_2cb8;
  char *local_2cb0;
  code *local_2ca8;
  undefined8 local_2ca0;
  char *local_2c98;
  code *local_2c90;
  undefined8 local_2c88;
  char *local_2c80;
  code *local_2c78;
  undefined8 local_2c70;
  char *local_2c68;
  code *local_2c60;
  undefined8 local_2c58;
  char *local_2c50;
  code *local_2c48;
  undefined8 local_2c40;
  char *local_2c38;
  code *local_2c30;
  undefined8 local_2c28;
  char *local_2c20;
  code *local_2c18;
  undefined8 local_2c10;
  char *local_2c08;
  code *local_2c00;
  undefined8 local_2bf8;
  char *local_2bf0;
  code *local_2be8;
  undefined8 local_2be0;
  char *local_2bd8;
  code *local_2bd0;
  undefined8 local_2bc8;
  char *local_2bc0;
  code *local_2bb8;
  undefined8 local_2bb0;
  char *local_2ba8;
  code *local_2ba0;
  undefined8 local_2b98;
  char *local_2b90;
  code *local_2b88;
  undefined8 local_2b80;
  char *local_2b78;
  code *local_2b70;
  undefined8 local_2b68;
  char *local_2b60;
  code *local_2b58;
  undefined8 local_2b50;
  char *local_2b48;
  code *local_2b40;
  undefined8 local_2b38;
  char *local_2b30;
  code *local_2b28;
  undefined8 local_2b20;
  char *local_2b18;
  code *local_2b10;
  undefined8 local_2b08;
  char *local_2b00;
  code *local_2af8;
  undefined8 local_2af0;
  char *local_2ae8;
  code *local_2ae0;
  undefined8 local_2ad8;
  char *local_2ad0;
  code *local_2ac8;
  undefined8 local_2ac0;
  char *local_2ab8;
  code *local_2ab0;
  undefined8 local_2aa8;
  char *local_2aa0;
  code *local_2a98;
  undefined8 local_2a90;
  char *local_2a78;
  code *local_2a70;
  undefined8 local_2a68;
  _Any_data *local_2a60;
  _Any_data local_2a58 [2];
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_2a30;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_2a08;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_29e0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_29b8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_2990;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_2968;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_2940;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_2918;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_28f0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_28c8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_28a0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_2878;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_2850;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_2828;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_2800;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_27d8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_27b0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_2788;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_2760;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_2738;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_2710;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_26e8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_26c0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_2698;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_2670;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_2648;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_2620;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_25f8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_25d0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_25a8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_2580;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_2558;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_2530;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_2508;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_24e0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_24b8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_2490;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_2468;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_2440;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_2418;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_23f0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_23c8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_23a0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_2378;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_2350;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_2328;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_2300;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_22d8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_22b0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_2288;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_2260;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_2238;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_2210;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_21e8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_21c0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_2198;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_2170;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_2148;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_2120;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_20f8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_20d0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_20a8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_2080;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_2058;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_2030;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_2008;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1fe0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1fb8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1f90;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1f68;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1f40;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1f18;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1ef0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1ec8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1ea0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1e78;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1e50;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1e28;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1e00;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1dd8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1db0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1d88;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1d60;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1d38;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1d10;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1ce8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1cc0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1c98;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1c70;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1c48;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1c20;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1bf8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1bd0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1ba8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1b80;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1b58;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1b30;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1b08;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1ae0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1ab8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1a90;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1a68;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1a40;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1a18;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_19f0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_19c8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_19a0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1978;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1950;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1928;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1900;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_18d8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_18b0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1888;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1860;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1838;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1810;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_17e8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_17c0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1798;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1770;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1748;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1720;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_16f8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_16d0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_16a8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1680;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1658;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1630;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1608;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_15e0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_15b8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1590;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1568;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1540;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1518;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_14f0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_14c8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_14a0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1478;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1450;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1428;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1400;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_13d8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_13b0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1388;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1360;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1338;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1310;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_12e8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_12c0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1298;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1270;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1248;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1220;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_11f8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_11d0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_11a8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1180;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1158;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1130;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1108;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_10e0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_10b8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1090;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1068;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1040;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1018;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_ff0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_fc8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_fa0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_f78;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_f50;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_f28;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_f00;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_ed8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_eb0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_e88;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_e60;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_e38;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_e10;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_de8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_dc0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_d98;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_d70;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_d48;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_d20;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_cf8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_cd0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_ca8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_c80;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_c58;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_c30;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_c08;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_be0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_bb8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_b90;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_b68;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_b40;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_b18;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_af0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_ac8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_aa0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_a78;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_a50;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_a28;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_a00;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_9d8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_9b0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_988;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_960;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_938;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_910;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_8e8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_8c0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_898;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_870;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_848;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_820;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_7f8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_7d0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_7a8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_780;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_758;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_730;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_708;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_6e0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_6b8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_690;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_668;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_640;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_618;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_5f0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_5c8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_5a0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_578;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_550;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_528;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_500;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_4d8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_4b0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_488;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_460;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_438;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_410;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_3e8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_3c0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_398;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_370;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_348;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_320;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_2f8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_2d0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_2a8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_280;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_258;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_230;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_208;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1e0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_1b8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_190;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_168;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_140;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_118;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_f0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_c8;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_a0;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_78;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_50;
  _Any_data local_28;
  TestSuite *local_18;
  TestSuite *suite_local;
  SemanticModelTester *this_local;
  
  local_18 = suite;
  suite_local = (TestSuite *)this;
  Tester::Tester(&this->super_Tester,suite);
  (this->super_Tester)._vptr_Tester = (_func_int **)&PTR__SemanticModelTester_00735ec8;
  std::unique_ptr<psy::C::SyntaxTree,std::default_delete<psy::C::SyntaxTree>>::
  unique_ptr<std::default_delete<psy::C::SyntaxTree>,void>
            ((unique_ptr<psy::C::SyntaxTree,std::default_delete<psy::C::SyntaxTree>> *)&this->tree_)
  ;
  std::unique_ptr<psy::C::Compilation,std::default_delete<psy::C::Compilation>>::
  unique_ptr<std::default_delete<psy::C::Compilation>,void>
            ((unique_ptr<psy::C::Compilation,std::default_delete<psy::C::Compilation>> *)
             &this->compilation_);
  local_2a60 = local_2a58;
  local_2a70 = case0001;
  local_2a68 = 0;
  local_2a78 = "case0001";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2a70,&local_2a78);
  local_2a60 = (_Any_data *)&local_2a30;
  local_2a98 = case0002;
  local_2a90 = 0;
  local_2aa0 = "case0002";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2a98,&local_2aa0);
  local_2a60 = (_Any_data *)&local_2a08;
  local_2ab0 = case0003;
  local_2aa8 = 0;
  local_2ab8 = "case0003";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2ab0,&local_2ab8);
  local_2a60 = (_Any_data *)&local_29e0;
  local_2ac8 = case0004;
  local_2ac0 = 0;
  local_2ad0 = "case0004";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2ac8,&local_2ad0);
  local_2a60 = (_Any_data *)&local_29b8;
  local_2ae0 = case0005;
  local_2ad8 = 0;
  local_2ae8 = "case0005";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2ae0,&local_2ae8);
  local_2a60 = (_Any_data *)&local_2990;
  local_2af8 = case0006;
  local_2af0 = 0;
  local_2b00 = "case0006";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2af8,&local_2b00);
  local_2a60 = (_Any_data *)&local_2968;
  local_2b10 = case0007;
  local_2b08 = 0;
  local_2b18 = "case0007";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2b10,&local_2b18);
  local_2a60 = (_Any_data *)&local_2940;
  local_2b28 = case0008;
  local_2b20 = 0;
  local_2b30 = "case0008";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2b28,&local_2b30);
  local_2a60 = (_Any_data *)&local_2918;
  local_2b40 = case0009;
  local_2b38 = 0;
  local_2b48 = "case0009";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2b40,&local_2b48);
  local_2a60 = (_Any_data *)&local_28f0;
  local_2b58 = case0010;
  local_2b50 = 0;
  local_2b60 = "case0010";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2b58,&local_2b60);
  local_2a60 = (_Any_data *)&local_28c8;
  local_2b70 = case0090;
  local_2b68 = 0;
  local_2b78 = "case0090";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2b70,&local_2b78);
  local_2a60 = (_Any_data *)&local_28a0;
  local_2b88 = case0091;
  local_2b80 = 0;
  local_2b90 = "case0091";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2b88,&local_2b90);
  local_2a60 = (_Any_data *)&local_2878;
  local_2ba0 = case0092;
  local_2b98 = 0;
  local_2ba8 = "case0092";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2ba0,&local_2ba8);
  local_2a60 = (_Any_data *)&local_2850;
  local_2bb8 = case0093;
  local_2bb0 = 0;
  local_2bc0 = "case0093";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2bb8,&local_2bc0);
  local_2a60 = (_Any_data *)&local_2828;
  local_2bd0 = case0094;
  local_2bc8 = 0;
  local_2bd8 = "case0094";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2bd0,&local_2bd8);
  local_2a60 = (_Any_data *)&local_2800;
  local_2be8 = case0095;
  local_2be0 = 0;
  local_2bf0 = "case0095";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2be8,&local_2bf0);
  local_2a60 = (_Any_data *)&local_27d8;
  local_2c00 = case0096;
  local_2bf8 = 0;
  local_2c08 = "case0096";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2c00,&local_2c08);
  local_2a60 = (_Any_data *)&local_27b0;
  local_2c18 = case0097;
  local_2c10 = 0;
  local_2c20 = "case0097";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2c18,&local_2c20);
  local_2a60 = (_Any_data *)&local_2788;
  local_2c30 = case0098;
  local_2c28 = 0;
  local_2c38 = "case0098";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2c30,&local_2c38);
  local_2a60 = (_Any_data *)&local_2760;
  local_2c48 = case0099;
  local_2c40 = 0;
  local_2c50 = "case0099";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2c48,&local_2c50);
  local_2a60 = (_Any_data *)&local_2738;
  local_2c60 = case0101;
  local_2c58 = 0;
  local_2c68 = "case0101";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2c60,&local_2c68);
  local_2a60 = (_Any_data *)&local_2710;
  local_2c78 = case0102;
  local_2c70 = 0;
  local_2c80 = "case0102";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2c78,&local_2c80);
  local_2a60 = (_Any_data *)&local_26e8;
  local_2c90 = case0103;
  local_2c88 = 0;
  local_2c98 = "case0103";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2c90,&local_2c98);
  local_2a60 = (_Any_data *)&local_26c0;
  local_2ca8 = case0104;
  local_2ca0 = 0;
  local_2cb0 = "case0104";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2ca8,&local_2cb0);
  local_2a60 = (_Any_data *)&local_2698;
  local_2cc0 = case0105;
  local_2cb8 = 0;
  local_2cc8 = "case0105";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2cc0,&local_2cc8);
  local_2a60 = (_Any_data *)&local_2670;
  local_2cd8 = case0106;
  local_2cd0 = 0;
  local_2ce0 = "case0106";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2cd8,&local_2ce0);
  local_2a60 = (_Any_data *)&local_2648;
  local_2cf0 = case0107;
  local_2ce8 = 0;
  local_2cf8 = "case0107";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2cf0,&local_2cf8);
  local_2a60 = (_Any_data *)&local_2620;
  local_2d08 = case0108;
  local_2d00 = 0;
  local_2d10 = "case0108";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2d08,&local_2d10);
  local_2a60 = (_Any_data *)&local_25f8;
  local_2d20 = case0109;
  local_2d18 = 0;
  local_2d28 = "case0109";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2d20,&local_2d28);
  local_2a60 = (_Any_data *)&local_25d0;
  local_2d38 = case0110;
  local_2d30 = 0;
  local_2d40 = "case0110";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2d38,&local_2d40);
  local_2a60 = (_Any_data *)&local_25a8;
  local_2d50 = case0150;
  local_2d48 = 0;
  local_2d58 = "case0150";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2d50,&local_2d58);
  local_2a60 = (_Any_data *)&local_2580;
  local_2d68 = case0151;
  local_2d60 = 0;
  local_2d70 = "case0151";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2d68,&local_2d70);
  local_2a60 = (_Any_data *)&local_2558;
  local_2d80 = case0152;
  local_2d78 = 0;
  local_2d88 = "case0152";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2d80,&local_2d88);
  local_2a60 = (_Any_data *)&local_2530;
  local_2d98 = case0153;
  local_2d90 = 0;
  local_2da0 = "case0153";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2d98,&local_2da0);
  local_2a60 = (_Any_data *)&local_2508;
  local_2db0 = case0154;
  local_2da8 = 0;
  local_2db8 = "case0154";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2db0,&local_2db8);
  local_2a60 = (_Any_data *)&local_24e0;
  local_2dc8 = case0155;
  local_2dc0 = 0;
  local_2dd0 = "case0155";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2dc8,&local_2dd0);
  local_2a60 = (_Any_data *)&local_24b8;
  local_2de0 = case0156;
  local_2dd8 = 0;
  local_2de8 = "case0156";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2de0,&local_2de8);
  local_2a60 = (_Any_data *)&local_2490;
  local_2df8 = case0157;
  local_2df0 = 0;
  local_2e00 = "case0157";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2df8,&local_2e00);
  local_2a60 = (_Any_data *)&local_2468;
  local_2e10 = case0158;
  local_2e08 = 0;
  local_2e18 = "case0158";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2e10,&local_2e18);
  local_2a60 = (_Any_data *)&local_2440;
  local_2e28 = case0159;
  local_2e20 = 0;
  local_2e30 = "case0159";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2e28,&local_2e30);
  local_2a60 = (_Any_data *)&local_2418;
  local_2e40 = case0201;
  local_2e38 = 0;
  local_2e48 = "case0201";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2e40,&local_2e48);
  local_2a60 = (_Any_data *)&local_23f0;
  local_2e58 = case0202;
  local_2e50 = 0;
  local_2e60 = "case0202";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2e58,&local_2e60);
  local_2a60 = (_Any_data *)&local_23c8;
  local_2e70 = case0203;
  local_2e68 = 0;
  local_2e78 = "case0203";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2e70,&local_2e78);
  local_2a60 = (_Any_data *)&local_23a0;
  local_2e88 = case0204;
  local_2e80 = 0;
  local_2e90 = "case0204";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2e88,&local_2e90);
  local_2a60 = (_Any_data *)&local_2378;
  local_2ea0 = case0205;
  local_2e98 = 0;
  local_2ea8 = "case0205";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2ea0,&local_2ea8);
  local_2a60 = (_Any_data *)&local_2350;
  local_2eb8 = case0206;
  local_2eb0 = 0;
  local_2ec0 = "case0206";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2eb8,&local_2ec0);
  local_2a60 = (_Any_data *)&local_2328;
  local_2ed0 = case0207;
  local_2ec8 = 0;
  local_2ed8 = "case0207";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2ed0,&local_2ed8);
  local_2a60 = (_Any_data *)&local_2300;
  local_2ee8 = case0208;
  local_2ee0 = 0;
  local_2ef0 = "case0208";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2ee8,&local_2ef0);
  local_2a60 = (_Any_data *)&local_22d8;
  local_2f00 = case0209;
  local_2ef8 = 0;
  local_2f08 = "case0209";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2f00,&local_2f08);
  local_2a60 = (_Any_data *)&local_22b0;
  local_2f18 = case0210;
  local_2f10 = 0;
  local_2f20 = "case0210";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2f18,&local_2f20);
  local_2a60 = (_Any_data *)&local_2288;
  local_2f30 = case0211;
  local_2f28 = 0;
  local_2f38 = "case0211";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2f30,&local_2f38);
  local_2a60 = (_Any_data *)&local_2260;
  local_2f48 = case0212;
  local_2f40 = 0;
  local_2f50 = "case0212";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2f48,&local_2f50);
  local_2a60 = (_Any_data *)&local_2238;
  local_2f60 = case0213;
  local_2f58 = 0;
  local_2f68 = "case0213";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2f60,&local_2f68);
  local_2a60 = (_Any_data *)&local_2210;
  local_2f78 = case0214;
  local_2f70 = 0;
  local_2f80 = "case0214";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2f78,&local_2f80);
  local_2a60 = (_Any_data *)&local_21e8;
  local_2f90 = case0215;
  local_2f88 = 0;
  local_2f98 = "case0215";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2f90,&local_2f98);
  local_2a60 = (_Any_data *)&local_21c0;
  local_2fa8 = case0216;
  local_2fa0 = 0;
  local_2fb0 = "case0216";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2fa8,&local_2fb0);
  local_2a60 = (_Any_data *)&local_2198;
  local_2fc0 = case0217;
  local_2fb8 = 0;
  local_2fc8 = "case0217";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2fc0,&local_2fc8);
  local_2a60 = (_Any_data *)&local_2170;
  local_2fd8 = case0218;
  local_2fd0 = 0;
  local_2fe0 = "case0218";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2fd8,&local_2fe0);
  local_2a60 = (_Any_data *)&local_2148;
  local_2ff0 = case0219;
  local_2fe8 = 0;
  local_2ff8 = "case0219";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_2ff0,&local_2ff8);
  local_2a60 = (_Any_data *)&local_2120;
  local_3008 = case0220;
  local_3000 = 0;
  local_3010 = "case0220";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3008,&local_3010);
  local_2a60 = (_Any_data *)&local_20f8;
  local_3020 = case0300;
  local_3018 = 0;
  local_3028 = "case0300";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3020,&local_3028);
  local_2a60 = (_Any_data *)&local_20d0;
  local_3038 = case0301;
  local_3030 = 0;
  local_3040 = "case0301";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3038,&local_3040);
  local_2a60 = (_Any_data *)&local_20a8;
  local_3050 = case0302;
  local_3048 = 0;
  local_3058 = "case0302";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3050,&local_3058);
  local_2a60 = (_Any_data *)&local_2080;
  local_3068 = case0303;
  local_3060 = 0;
  local_3070 = "case0303";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3068,&local_3070);
  local_2a60 = (_Any_data *)&local_2058;
  local_3080 = case0304;
  local_3078 = 0;
  local_3088 = "case0304";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3080,&local_3088);
  local_2a60 = (_Any_data *)&local_2030;
  local_3098 = case0305;
  local_3090 = 0;
  local_30a0 = "case0305";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3098,&local_30a0);
  local_2a60 = (_Any_data *)&local_2008;
  local_30b0 = case0306;
  local_30a8 = 0;
  local_30b8 = "case0306";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_30b0,&local_30b8);
  local_2a60 = (_Any_data *)&local_1fe0;
  local_30c8 = case0307;
  local_30c0 = 0;
  local_30d0 = "case0307";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_30c8,&local_30d0);
  local_2a60 = (_Any_data *)&local_1fb8;
  local_30e0 = case0308;
  local_30d8 = 0;
  local_30e8 = "case0308";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_30e0,&local_30e8);
  local_2a60 = (_Any_data *)&local_1f90;
  local_30f8 = case0309;
  local_30f0 = 0;
  local_3100 = "case0309";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_30f8,&local_3100);
  local_2a60 = (_Any_data *)&local_1f68;
  local_3110 = case0310;
  local_3108 = 0;
  local_3118 = "case0310";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3110,&local_3118);
  local_2a60 = (_Any_data *)&local_1f40;
  local_3128 = case0311;
  local_3120 = 0;
  local_3130 = "case0311";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3128,&local_3130);
  local_2a60 = (_Any_data *)&local_1f18;
  local_3140 = case0312;
  local_3138 = 0;
  local_3148 = "case0312";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3140,&local_3148);
  local_2a60 = (_Any_data *)&local_1ef0;
  local_3158 = case0313;
  local_3150 = 0;
  local_3160 = "case0313";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3158,&local_3160);
  local_2a60 = (_Any_data *)&local_1ec8;
  local_3170 = case0314;
  local_3168 = 0;
  local_3178 = "case0314";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3170,&local_3178);
  local_2a60 = (_Any_data *)&local_1ea0;
  local_3188 = case0315;
  local_3180 = 0;
  local_3190 = "case0315";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3188,&local_3190);
  local_2a60 = (_Any_data *)&local_1e78;
  local_31a0 = case0316;
  local_3198 = 0;
  local_31a8 = "case0316";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_31a0,&local_31a8);
  local_2a60 = (_Any_data *)&local_1e50;
  local_31b8 = case0317;
  local_31b0 = 0;
  local_31c0 = "case0317";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_31b8,&local_31c0);
  local_2a60 = (_Any_data *)&local_1e28;
  local_31d0 = case0318;
  local_31c8 = 0;
  local_31d8 = "case0318";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_31d0,&local_31d8);
  local_2a60 = (_Any_data *)&local_1e00;
  local_31e8 = case0319;
  local_31e0 = 0;
  local_31f0 = "case0319";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_31e8,&local_31f0);
  local_2a60 = (_Any_data *)&local_1dd8;
  local_3200 = case0320;
  local_31f8 = 0;
  local_3208 = "case0320";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3200,&local_3208);
  local_2a60 = (_Any_data *)&local_1db0;
  local_3218 = case0321;
  local_3210 = 0;
  local_3220 = "case0321";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3218,&local_3220);
  local_2a60 = (_Any_data *)&local_1d88;
  local_3230 = case0322;
  local_3228 = 0;
  local_3238 = "case0322";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3230,&local_3238);
  local_2a60 = (_Any_data *)&local_1d60;
  local_3248 = case0323;
  local_3240 = 0;
  local_3250 = "case0323";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3248,&local_3250);
  local_2a60 = (_Any_data *)&local_1d38;
  local_3260 = case0324;
  local_3258 = 0;
  local_3268 = "case0324";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3260,&local_3268);
  local_2a60 = (_Any_data *)&local_1d10;
  local_3278 = case0325;
  local_3270 = 0;
  local_3280 = "case0325";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3278,&local_3280);
  local_2a60 = (_Any_data *)&local_1ce8;
  local_3290 = case0326;
  local_3288 = 0;
  local_3298 = "case0326";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3290,&local_3298);
  local_2a60 = (_Any_data *)&local_1cc0;
  local_32a8 = case0327;
  local_32a0 = 0;
  local_32b0 = "case0327";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_32a8,&local_32b0);
  local_2a60 = (_Any_data *)&local_1c98;
  local_32c0 = case0328;
  local_32b8 = 0;
  local_32c8 = "case0328";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_32c0,&local_32c8);
  local_2a60 = (_Any_data *)&local_1c70;
  local_32d8 = case0329;
  local_32d0 = 0;
  local_32e0 = "case0329";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_32d8,&local_32e0);
  local_2a60 = (_Any_data *)&local_1c48;
  local_32f0 = case0330;
  local_32e8 = 0;
  local_32f8 = "case0330";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_32f0,&local_32f8);
  local_2a60 = (_Any_data *)&local_1c20;
  local_3308 = case0331;
  local_3300 = 0;
  local_3310 = "case0331";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3308,&local_3310);
  local_2a60 = (_Any_data *)&local_1bf8;
  local_3320 = case0332;
  local_3318 = 0;
  local_3328 = "case0332";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3320,&local_3328);
  local_2a60 = (_Any_data *)&local_1bd0;
  local_3338 = case0333;
  local_3330 = 0;
  local_3340 = "case0333";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3338,&local_3340);
  local_2a60 = (_Any_data *)&local_1ba8;
  local_3350 = case0334;
  local_3348 = 0;
  local_3358 = "case0334";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3350,&local_3358);
  local_2a60 = (_Any_data *)&local_1b80;
  local_3368 = case0335;
  local_3360 = 0;
  local_3370 = "case0335";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3368,&local_3370);
  local_2a60 = (_Any_data *)&local_1b58;
  local_3380 = case0336;
  local_3378 = 0;
  local_3388 = "case0336";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3380,&local_3388);
  local_2a60 = (_Any_data *)&local_1b30;
  local_3398 = case0337;
  local_3390 = 0;
  local_33a0 = "case0337";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3398,&local_33a0);
  local_2a60 = (_Any_data *)&local_1b08;
  local_33b0 = case0338;
  local_33a8 = 0;
  local_33b8 = "case0338";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_33b0,&local_33b8);
  local_2a60 = (_Any_data *)&local_1ae0;
  local_33c8 = case0339;
  local_33c0 = 0;
  local_33d0 = "case0339";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_33c8,&local_33d0);
  local_2a60 = (_Any_data *)&local_1ab8;
  local_33e0 = case0340;
  local_33d8 = 0;
  local_33e8 = "case0340";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_33e0,&local_33e8);
  local_2a60 = (_Any_data *)&local_1a90;
  local_33f8 = case0341;
  local_33f0 = 0;
  local_3400 = "case0341";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_33f8,&local_3400);
  local_2a60 = (_Any_data *)&local_1a68;
  local_3410 = case0342;
  local_3408 = 0;
  local_3418 = "case0342";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3410,&local_3418);
  local_2a60 = (_Any_data *)&local_1a40;
  local_3428 = case0343;
  local_3420 = 0;
  local_3430 = "case0343";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3428,&local_3430);
  local_2a60 = (_Any_data *)&local_1a18;
  local_3440 = case0344;
  local_3438 = 0;
  local_3448 = "case0344";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3440,&local_3448);
  local_2a60 = (_Any_data *)&local_19f0;
  local_3458 = case0345;
  local_3450 = 0;
  local_3460 = "case0345";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3458,&local_3460);
  local_2a60 = (_Any_data *)&local_19c8;
  local_3470 = case0346;
  local_3468 = 0;
  local_3478 = "case0346";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3470,&local_3478);
  local_2a60 = (_Any_data *)&local_19a0;
  local_3488 = case0347;
  local_3480 = 0;
  local_3490 = "case0347";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3488,&local_3490);
  local_2a60 = (_Any_data *)&local_1978;
  local_34a0 = case0348;
  local_3498 = 0;
  local_34a8 = "case0348";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_34a0,&local_34a8);
  local_2a60 = (_Any_data *)&local_1950;
  local_34b8 = case0349;
  local_34b0 = 0;
  local_34c0 = "case0349";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_34b8,&local_34c0);
  local_2a60 = (_Any_data *)&local_1928;
  local_34d0 = case0350;
  local_34c8 = 0;
  local_34d8 = "case0350";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_34d0,&local_34d8);
  local_2a60 = (_Any_data *)&local_1900;
  local_34e8 = case0351;
  local_34e0 = 0;
  local_34f0 = "case0351";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_34e8,&local_34f0);
  local_2a60 = (_Any_data *)&local_18d8;
  local_3500 = case0352;
  local_34f8 = 0;
  local_3508 = "case0352";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3500,&local_3508);
  local_2a60 = (_Any_data *)&local_18b0;
  local_3518 = case0353;
  local_3510 = 0;
  local_3520 = "case0353";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3518,&local_3520);
  local_2a60 = (_Any_data *)&local_1888;
  local_3530 = case0354;
  local_3528 = 0;
  local_3538 = "case0354";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3530,&local_3538);
  local_2a60 = (_Any_data *)&local_1860;
  local_3548 = case0355;
  local_3540 = 0;
  local_3550 = "case0355";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3548,&local_3550);
  local_2a60 = (_Any_data *)&local_1838;
  local_3560 = case0356;
  local_3558 = 0;
  local_3568 = "case0356";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3560,&local_3568);
  local_2a60 = (_Any_data *)&local_1810;
  local_3578 = case0357;
  local_3570 = 0;
  local_3580 = "case0357";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3578,&local_3580);
  local_2a60 = (_Any_data *)&local_17e8;
  local_3590 = case0358;
  local_3588 = 0;
  local_3598 = "case0358";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3590,&local_3598);
  local_2a60 = (_Any_data *)&local_17c0;
  local_35a8 = case0359;
  local_35a0 = 0;
  local_35b0 = "case0359";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_35a8,&local_35b0);
  local_2a60 = (_Any_data *)&local_1798;
  local_35c0 = case0360;
  local_35b8 = 0;
  local_35c8 = "case0360";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_35c0,&local_35c8);
  local_2a60 = (_Any_data *)&local_1770;
  local_35d8 = case0361;
  local_35d0 = 0;
  local_35e0 = "case0361";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_35d8,&local_35e0);
  local_2a60 = (_Any_data *)&local_1748;
  local_35f0 = case0362;
  local_35e8 = 0;
  local_35f8 = "case0362";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_35f0,&local_35f8);
  local_2a60 = (_Any_data *)&local_1720;
  local_3608 = case0363;
  local_3600 = 0;
  local_3610 = "case0363";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3608,&local_3610);
  local_2a60 = (_Any_data *)&local_16f8;
  local_3620 = case0364;
  local_3618 = 0;
  local_3628 = "case0364";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3620,&local_3628);
  local_2a60 = (_Any_data *)&local_16d0;
  local_3638 = case0365;
  local_3630 = 0;
  local_3640 = "case0365";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3638,&local_3640);
  local_2a60 = (_Any_data *)&local_16a8;
  local_3650 = case0366;
  local_3648 = 0;
  local_3658 = "case0366";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3650,&local_3658);
  local_2a60 = (_Any_data *)&local_1680;
  local_3668 = case0367;
  local_3660 = 0;
  local_3670 = "case0367";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3668,&local_3670);
  local_2a60 = (_Any_data *)&local_1658;
  local_3680 = case0368;
  local_3678 = 0;
  local_3688 = "case0368";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3680,&local_3688);
  local_2a60 = (_Any_data *)&local_1630;
  local_3698 = case0369;
  local_3690 = 0;
  local_36a0 = "case0369";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3698,&local_36a0);
  local_2a60 = (_Any_data *)&local_1608;
  local_36b0 = case0370;
  local_36a8 = 0;
  local_36b8 = "case0370";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_36b0,&local_36b8);
  local_2a60 = (_Any_data *)&local_15e0;
  local_36c8 = case0371;
  local_36c0 = 0;
  local_36d0 = "case0371";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_36c8,&local_36d0);
  local_2a60 = (_Any_data *)&local_15b8;
  local_36e0 = case0372;
  local_36d8 = 0;
  local_36e8 = "case0372";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_36e0,&local_36e8);
  local_2a60 = (_Any_data *)&local_1590;
  local_36f8 = case0373;
  local_36f0 = 0;
  local_3700 = "case0373";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_36f8,&local_3700);
  local_2a60 = (_Any_data *)&local_1568;
  local_3710 = case0374;
  local_3708 = 0;
  local_3718 = "case0374";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3710,&local_3718);
  local_2a60 = (_Any_data *)&local_1540;
  local_3728 = case0375;
  local_3720 = 0;
  local_3730 = "case0375";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3728,&local_3730);
  local_2a60 = (_Any_data *)&local_1518;
  local_3740 = case0376;
  local_3738 = 0;
  local_3748 = "case0376";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3740,&local_3748);
  local_2a60 = (_Any_data *)&local_14f0;
  local_3758 = case0377;
  local_3750 = 0;
  local_3760 = "case0377";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3758,&local_3760);
  local_2a60 = (_Any_data *)&local_14c8;
  local_3770 = case0378;
  local_3768 = 0;
  local_3778 = "case0378";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3770,&local_3778);
  local_2a60 = (_Any_data *)&local_14a0;
  local_3788 = case0379;
  local_3780 = 0;
  local_3790 = "case0379";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3788,&local_3790);
  local_2a60 = (_Any_data *)&local_1478;
  local_37a0 = case0380;
  local_3798 = 0;
  local_37a8 = "case0380";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_37a0,&local_37a8);
  local_2a60 = (_Any_data *)&local_1450;
  local_37b8 = case0381;
  local_37b0 = 0;
  local_37c0 = "case0381";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_37b8,&local_37c0);
  local_2a60 = (_Any_data *)&local_1428;
  local_37d0 = case0382;
  local_37c8 = 0;
  local_37d8 = "case0382";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_37d0,&local_37d8);
  local_2a60 = (_Any_data *)&local_1400;
  local_37e8 = case0383;
  local_37e0 = 0;
  local_37f0 = "case0383";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_37e8,&local_37f0);
  local_2a60 = (_Any_data *)&local_13d8;
  local_3800 = case0384;
  local_37f8 = 0;
  local_3808 = "case0384";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3800,&local_3808);
  local_2a60 = (_Any_data *)&local_13b0;
  local_3818 = case0385;
  local_3810 = 0;
  local_3820 = "case0385";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3818,&local_3820);
  local_2a60 = (_Any_data *)&local_1388;
  local_3830 = case0386;
  local_3828 = 0;
  local_3838 = "case0386";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3830,&local_3838);
  local_2a60 = (_Any_data *)&local_1360;
  local_3848 = case0387;
  local_3840 = 0;
  local_3850 = "case0387";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3848,&local_3850);
  local_2a60 = (_Any_data *)&local_1338;
  local_3860 = case0388;
  local_3858 = 0;
  local_3868 = "case0388";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3860,&local_3868);
  local_2a60 = (_Any_data *)&local_1310;
  local_3878 = case0389;
  local_3870 = 0;
  local_3880 = "case0389";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3878,&local_3880);
  local_2a60 = (_Any_data *)&local_12e8;
  local_3890 = case0390;
  local_3888 = 0;
  local_3898 = "case0390";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3890,&local_3898);
  local_2a60 = (_Any_data *)&local_12c0;
  local_38a8 = case0391;
  local_38a0 = 0;
  local_38b0 = "case0391";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_38a8,&local_38b0);
  local_2a60 = (_Any_data *)&local_1298;
  local_38c0 = case0392;
  local_38b8 = 0;
  local_38c8 = "case0392";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_38c0,&local_38c8);
  local_2a60 = (_Any_data *)&local_1270;
  local_38d8 = case0393;
  local_38d0 = 0;
  local_38e0 = "case0393";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_38d8,&local_38e0);
  local_2a60 = (_Any_data *)&local_1248;
  local_38f0 = case0394;
  local_38e8 = 0;
  local_38f8 = "case0394";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_38f0,&local_38f8);
  local_2a60 = (_Any_data *)&local_1220;
  local_3908 = case0395;
  local_3900 = 0;
  local_3910 = "case0395";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3908,&local_3910);
  local_2a60 = (_Any_data *)&local_11f8;
  local_3920 = case0396;
  local_3918 = 0;
  local_3928 = "case0396";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3920,&local_3928);
  local_2a60 = (_Any_data *)&local_11d0;
  local_3938 = case0397;
  local_3930 = 0;
  local_3940 = "case0397";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3938,&local_3940);
  local_2a60 = (_Any_data *)&local_11a8;
  local_3950 = case0398;
  local_3948 = 0;
  local_3958 = "case0398";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3950,&local_3958);
  local_2a60 = (_Any_data *)&local_1180;
  local_3968 = case0399;
  local_3960 = 0;
  local_3970 = "case0399";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3968,&local_3970);
  local_2a60 = (_Any_data *)&local_1158;
  local_3980 = case0400;
  local_3978 = 0;
  local_3988 = "case0400";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3980,&local_3988);
  local_2a60 = (_Any_data *)&local_1130;
  local_3998 = case0401;
  local_3990 = 0;
  local_39a0 = "case0401";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3998,&local_39a0);
  local_2a60 = (_Any_data *)&local_1108;
  local_39b0 = case0402;
  local_39a8 = 0;
  local_39b8 = "case0402";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_39b0,&local_39b8);
  local_2a60 = (_Any_data *)&local_10e0;
  local_39c8 = case0403;
  local_39c0 = 0;
  local_39d0 = "case0403";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_39c8,&local_39d0);
  local_2a60 = (_Any_data *)&local_10b8;
  local_39e0 = case0404;
  local_39d8 = 0;
  local_39e8 = "case0404";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_39e0,&local_39e8);
  local_2a60 = (_Any_data *)&local_1090;
  local_39f8 = case0405;
  local_39f0 = 0;
  local_3a00 = "case0405";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_39f8,&local_3a00);
  local_2a60 = (_Any_data *)&local_1068;
  local_3a10 = case0406;
  local_3a08 = 0;
  local_3a18 = "case0406";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3a10,&local_3a18);
  local_2a60 = (_Any_data *)&local_1040;
  local_3a28 = case0407;
  local_3a20 = 0;
  local_3a30 = "case0407";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3a28,&local_3a30);
  local_2a60 = (_Any_data *)&local_1018;
  local_3a40 = case0408;
  local_3a38 = 0;
  local_3a48 = "case0408";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3a40,&local_3a48);
  local_2a60 = (_Any_data *)&local_ff0;
  local_3a58 = case0409;
  local_3a50 = 0;
  local_3a60 = "case0409";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3a58,&local_3a60);
  local_2a60 = (_Any_data *)&local_fc8;
  local_3a70 = case0410;
  local_3a68 = 0;
  local_3a78 = "case0410";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3a70,&local_3a78);
  local_2a60 = (_Any_data *)&local_fa0;
  local_3a88 = case0411;
  local_3a80 = 0;
  local_3a90 = "case0411";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3a88,&local_3a90);
  local_2a60 = (_Any_data *)&local_f78;
  local_3aa0 = case0412;
  local_3a98 = 0;
  local_3aa8 = "case0412";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3aa0,&local_3aa8);
  local_2a60 = (_Any_data *)&local_f50;
  local_3ab8 = case0413;
  local_3ab0 = 0;
  local_3ac0 = "case0413";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3ab8,&local_3ac0);
  local_2a60 = (_Any_data *)&local_f28;
  local_3ad0 = case0414;
  local_3ac8 = 0;
  local_3ad8 = "case0414";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3ad0,&local_3ad8);
  local_2a60 = (_Any_data *)&local_f00;
  local_3ae8 = case0415;
  local_3ae0 = 0;
  local_3af0 = "case0415";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3ae8,&local_3af0);
  local_2a60 = (_Any_data *)&local_ed8;
  local_3b00 = case0416;
  local_3af8 = 0;
  local_3b08 = "case0416";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3b00,&local_3b08);
  local_2a60 = (_Any_data *)&local_eb0;
  local_3b18 = case0417;
  local_3b10 = 0;
  local_3b20 = "case0417";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3b18,&local_3b20);
  local_2a60 = (_Any_data *)&local_e88;
  local_3b30 = case0418;
  local_3b28 = 0;
  local_3b38 = "case0418";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3b30,&local_3b38);
  local_2a60 = (_Any_data *)&local_e60;
  local_3b48 = case0419;
  local_3b40 = 0;
  local_3b50 = "case0419";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3b48,&local_3b50);
  local_2a60 = (_Any_data *)&local_e38;
  local_3b60 = case0420;
  local_3b58 = 0;
  local_3b68 = "case0420";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3b60,&local_3b68);
  local_2a60 = (_Any_data *)&local_e10;
  local_3b78 = case0421;
  local_3b70 = 0;
  local_3b80 = "case0421";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3b78,&local_3b80);
  local_2a60 = (_Any_data *)&local_de8;
  local_3b90 = case0422;
  local_3b88 = 0;
  local_3b98 = "case0422";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3b90,&local_3b98);
  local_2a60 = (_Any_data *)&local_dc0;
  local_3ba8 = case0423;
  local_3ba0 = 0;
  local_3bb0 = "case0423";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3ba8,&local_3bb0);
  local_2a60 = (_Any_data *)&local_d98;
  local_3bc0 = case0424;
  local_3bb8 = 0;
  local_3bc8 = "case0424";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3bc0,&local_3bc8);
  local_2a60 = (_Any_data *)&local_d70;
  local_3bd8 = case0425;
  local_3bd0 = 0;
  local_3be0 = "case0425";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3bd8,&local_3be0);
  local_2a60 = (_Any_data *)&local_d48;
  local_3bf0 = case0426;
  local_3be8 = 0;
  local_3bf8 = "case0426";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3bf0,&local_3bf8);
  local_2a60 = (_Any_data *)&local_d20;
  local_3c08 = case0427;
  local_3c00 = 0;
  local_3c10 = "case0427";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3c08,&local_3c10);
  local_2a60 = (_Any_data *)&local_cf8;
  local_3c20 = case0428;
  local_3c18 = 0;
  local_3c28 = "case0428";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3c20,&local_3c28);
  local_2a60 = (_Any_data *)&local_cd0;
  local_3c38 = case0429;
  local_3c30 = 0;
  local_3c40 = "case0429";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3c38,&local_3c40);
  local_2a60 = (_Any_data *)&local_ca8;
  local_3c50 = case0430;
  local_3c48 = 0;
  local_3c58 = "case0430";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3c50,&local_3c58);
  local_2a60 = (_Any_data *)&local_c80;
  local_3c68 = case0431;
  local_3c60 = 0;
  local_3c70 = "case0431";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3c68,&local_3c70);
  local_2a60 = (_Any_data *)&local_c58;
  local_3c80 = case0432;
  local_3c78 = 0;
  local_3c88 = "case0432";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3c80,&local_3c88);
  local_2a60 = (_Any_data *)&local_c30;
  local_3c98 = case0433;
  local_3c90 = 0;
  local_3ca0 = "case0433";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3c98,&local_3ca0);
  local_2a60 = (_Any_data *)&local_c08;
  local_3cb0 = case0434;
  local_3ca8 = 0;
  local_3cb8 = "case0434";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3cb0,&local_3cb8);
  local_2a60 = (_Any_data *)&local_be0;
  local_3cc8 = case0435;
  local_3cc0 = 0;
  local_3cd0 = "case0435";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3cc8,&local_3cd0);
  local_2a60 = (_Any_data *)&local_bb8;
  local_3ce0 = case0436;
  local_3cd8 = 0;
  local_3ce8 = "case0436";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3ce0,&local_3ce8);
  local_2a60 = (_Any_data *)&local_b90;
  local_3cf8 = case0437;
  local_3cf0 = 0;
  local_3d00 = "case0437";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3cf8,&local_3d00);
  local_2a60 = (_Any_data *)&local_b68;
  local_3d10 = case0438;
  local_3d08 = 0;
  local_3d18 = "case0438";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3d10,&local_3d18);
  local_2a60 = (_Any_data *)&local_b40;
  local_3d28 = case0439;
  local_3d20 = 0;
  local_3d30 = "case0439";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3d28,&local_3d30);
  local_2a60 = (_Any_data *)&local_b18;
  local_3d40 = case0440;
  local_3d38 = 0;
  local_3d48 = "case0440";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3d40,&local_3d48);
  local_2a60 = (_Any_data *)&local_af0;
  local_3d58 = case0441;
  local_3d50 = 0;
  local_3d60 = "case0441";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3d58,&local_3d60);
  local_2a60 = (_Any_data *)&local_ac8;
  local_3d70 = case0442;
  local_3d68 = 0;
  local_3d78 = "case0442";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3d70,&local_3d78);
  local_2a60 = (_Any_data *)&local_aa0;
  local_3d88 = case0443;
  local_3d80 = 0;
  local_3d90 = "case0443";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3d88,&local_3d90);
  local_2a60 = (_Any_data *)&local_a78;
  local_3da0 = case0444;
  local_3d98 = 0;
  local_3da8 = "case0444";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3da0,&local_3da8);
  local_2a60 = (_Any_data *)&local_a50;
  local_3db8 = case0445;
  local_3db0 = 0;
  local_3dc0 = "case0445";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3db8,&local_3dc0);
  local_2a60 = (_Any_data *)&local_a28;
  local_3dd0 = case0446;
  local_3dc8 = 0;
  local_3dd8 = "case0446";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3dd0,&local_3dd8);
  local_2a60 = (_Any_data *)&local_a00;
  local_3de8 = case0447;
  local_3de0 = 0;
  local_3df0 = "case0447";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3de8,&local_3df0);
  local_2a60 = (_Any_data *)&local_9d8;
  local_3e00 = case0448;
  local_3df8 = 0;
  local_3e08 = "case0448";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3e00,&local_3e08);
  local_2a60 = (_Any_data *)&local_9b0;
  local_3e18 = case0449;
  local_3e10 = 0;
  local_3e20 = "case0449";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3e18,&local_3e20);
  local_2a60 = (_Any_data *)&local_988;
  local_3e30 = case0450;
  local_3e28 = 0;
  local_3e38 = "case0450";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3e30,&local_3e38);
  local_2a60 = (_Any_data *)&local_960;
  local_3e48 = case0451;
  local_3e40 = 0;
  local_3e50 = "case0451";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3e48,&local_3e50);
  local_2a60 = (_Any_data *)&local_938;
  local_3e60 = case0452;
  local_3e58 = 0;
  local_3e68 = "case0452";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3e60,&local_3e68);
  local_2a60 = (_Any_data *)&local_910;
  local_3e78 = case0453;
  local_3e70 = 0;
  local_3e80 = "case0453";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3e78,&local_3e80);
  local_2a60 = (_Any_data *)&local_8e8;
  local_3e90 = case0454;
  local_3e88 = 0;
  local_3e98 = "case0454";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3e90,&local_3e98);
  local_2a60 = (_Any_data *)&local_8c0;
  local_3ea8 = case0455;
  local_3ea0 = 0;
  local_3eb0 = "case0455";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3ea8,&local_3eb0);
  local_2a60 = (_Any_data *)&local_898;
  local_3ec0 = case0456;
  local_3eb8 = 0;
  local_3ec8 = "case0456";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3ec0,&local_3ec8);
  local_2a60 = (_Any_data *)&local_870;
  local_3ed8 = case0457;
  local_3ed0 = 0;
  local_3ee0 = "case0457";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3ed8,&local_3ee0);
  local_2a60 = (_Any_data *)&local_848;
  local_3ef0 = case0458;
  local_3ee8 = 0;
  local_3ef8 = "case0458";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3ef0,&local_3ef8);
  local_2a60 = (_Any_data *)&local_820;
  local_3f08 = case0459;
  local_3f00 = 0;
  local_3f10 = "case0459";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3f08,&local_3f10);
  local_2a60 = (_Any_data *)&local_7f8;
  local_3f20 = case0460;
  local_3f18 = 0;
  local_3f28 = "case0460";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3f20,&local_3f28);
  local_2a60 = (_Any_data *)&local_7d0;
  local_3f38 = case0461;
  local_3f30 = 0;
  local_3f40 = "case0461";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3f38,&local_3f40);
  local_2a60 = (_Any_data *)&local_7a8;
  local_3f50 = case0462;
  local_3f48 = 0;
  local_3f58 = "case0462";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3f50,&local_3f58);
  local_2a60 = (_Any_data *)&local_780;
  local_3f68 = case0463;
  local_3f60 = 0;
  local_3f70 = "case0463";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3f68,&local_3f70);
  local_2a60 = (_Any_data *)&local_758;
  local_3f80 = case0464;
  local_3f78 = 0;
  local_3f88 = "case0464";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3f80,&local_3f88);
  local_2a60 = (_Any_data *)&local_730;
  local_3f98 = case0465;
  local_3f90 = 0;
  local_3fa0 = "case0465";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3f98,&local_3fa0);
  local_2a60 = (_Any_data *)&local_708;
  local_3fb0 = case0466;
  local_3fa8 = 0;
  local_3fb8 = "case0466";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3fb0,&local_3fb8);
  local_2a60 = (_Any_data *)&local_6e0;
  local_3fc8 = case0467;
  local_3fc0 = 0;
  local_3fd0 = "case0467";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3fc8,&local_3fd0);
  local_2a60 = (_Any_data *)&local_6b8;
  local_3fe0 = case0468;
  local_3fd8 = 0;
  local_3fe8 = "case0468";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3fe0,&local_3fe8);
  local_2a60 = (_Any_data *)&local_690;
  local_3ff8 = case0469;
  local_3ff0 = 0;
  local_4000 = "case0469";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_3ff8,&local_4000);
  local_2a60 = (_Any_data *)&local_668;
  local_4010 = case0470;
  local_4008 = 0;
  local_4018 = "case0470";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_4010,&local_4018);
  local_2a60 = (_Any_data *)&local_640;
  local_4028 = case0471;
  local_4020 = 0;
  local_4030 = "case0471";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_4028,&local_4030);
  local_2a60 = (_Any_data *)&local_618;
  local_4040 = case0472;
  local_4038 = 0;
  local_4048 = "case0472";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_4040,&local_4048);
  local_2a60 = (_Any_data *)&local_5f0;
  local_4058 = case0473;
  local_4050 = 0;
  local_4060 = "case0473";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_4058,&local_4060);
  local_2a60 = (_Any_data *)&local_5c8;
  local_4070 = case0474;
  local_4068 = 0;
  local_4078 = "case0474";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_4070,&local_4078);
  local_2a60 = (_Any_data *)&local_5a0;
  local_4088 = case0475;
  local_4080 = 0;
  local_4090 = "case0475";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_4088,&local_4090);
  local_2a60 = (_Any_data *)&local_578;
  local_40a0 = case0476;
  local_4098 = 0;
  local_40a8 = "case0476";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_40a0,&local_40a8);
  local_2a60 = (_Any_data *)&local_550;
  local_40b8 = case0477;
  local_40b0 = 0;
  local_40c0 = "case0477";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_40b8,&local_40c0);
  local_2a60 = (_Any_data *)&local_528;
  local_40d0 = case0478;
  local_40c8 = 0;
  local_40d8 = "case0478";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_40d0,&local_40d8);
  local_2a60 = (_Any_data *)&local_500;
  local_40e8 = case0479;
  local_40e0 = 0;
  local_40f0 = "case0479";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_40e8,&local_40f0);
  local_2a60 = (_Any_data *)&local_4d8;
  local_4100 = case0480;
  local_40f8 = 0;
  local_4108 = "case0480";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_4100,&local_4108);
  local_2a60 = (_Any_data *)&local_4b0;
  local_4118 = case0481;
  local_4110 = 0;
  local_4120 = "case0481";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_4118,&local_4120);
  local_2a60 = (_Any_data *)&local_488;
  local_4130 = case0482;
  local_4128 = 0;
  local_4138 = "case0482";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_4130,&local_4138);
  local_2a60 = (_Any_data *)&local_460;
  local_4148 = case0483;
  local_4140 = 0;
  local_4150 = "case0483";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_4148,&local_4150);
  local_2a60 = (_Any_data *)&local_438;
  local_4160 = case0484;
  local_4158 = 0;
  local_4168 = "case0484";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_4160,&local_4168);
  local_2a60 = (_Any_data *)&local_410;
  local_4178 = case0485;
  local_4170 = 0;
  local_4180 = "case0485";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_4178,&local_4180);
  local_2a60 = (_Any_data *)&local_3e8;
  local_4190 = case0486;
  local_4188 = 0;
  local_4198 = "case0486";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_4190,&local_4198);
  local_2a60 = (_Any_data *)&local_3c0;
  local_41a8 = case0487;
  local_41a0 = 0;
  local_41b0 = "case0487";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_41a8,&local_41b0);
  local_2a60 = (_Any_data *)&local_398;
  local_41c0 = case0488;
  local_41b8 = 0;
  local_41c8 = "case0488";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_41c0,&local_41c8);
  local_2a60 = (_Any_data *)&local_370;
  local_41d8 = case0489;
  local_41d0 = 0;
  local_41e0 = "case0489";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_41d8,&local_41e0);
  local_2a60 = (_Any_data *)&local_348;
  local_41f0 = case0490;
  local_41e8 = 0;
  local_41f8 = "case0490";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_41f0,&local_41f8);
  local_2a60 = (_Any_data *)&local_320;
  local_4208 = case0491;
  local_4200 = 0;
  local_4210 = "case0491";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_4208,&local_4210);
  local_2a60 = (_Any_data *)&local_2f8;
  local_4220 = case0492;
  local_4218 = 0;
  local_4228 = "case0492";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_4220,&local_4228);
  local_2a60 = (_Any_data *)&local_2d0;
  local_4238 = case0493;
  local_4230 = 0;
  local_4240 = "case0493";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_4238,&local_4240);
  local_2a60 = (_Any_data *)&local_2a8;
  local_4250 = case0494;
  local_4248 = 0;
  local_4258 = "case0494";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_4250,&local_4258);
  local_2a60 = (_Any_data *)&local_280;
  local_4268 = case0495;
  local_4260 = 0;
  local_4270 = "case0495";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_4268,&local_4270);
  local_2a60 = (_Any_data *)&local_258;
  local_4280 = case0496;
  local_4278 = 0;
  local_4288 = "case0496";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_4280,&local_4288);
  local_2a60 = (_Any_data *)&local_230;
  local_4298 = case0497;
  local_4290 = 0;
  local_42a0 = "case0497";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_4298,&local_42a0);
  local_2a60 = (_Any_data *)&local_208;
  local_42b0 = case0498;
  local_42a8 = 0;
  local_42b8 = "case0498";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_42b0,&local_42b8);
  local_2a60 = (_Any_data *)&local_1e0;
  local_42c8 = case0499;
  local_42c0 = 0;
  local_42d0 = "case0499";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_42c8,&local_42d0);
  local_2a60 = (_Any_data *)&local_1b8;
  local_42e0 = case0500;
  local_42d8 = 0;
  local_42e8 = "case0500";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_42e0,&local_42e8);
  local_2a60 = (_Any_data *)&local_190;
  local_42f8 = case0501;
  local_42f0 = 0;
  local_4300 = "case0501";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_42f8,&local_4300);
  local_2a60 = (_Any_data *)&local_168;
  local_4310 = case0502;
  local_4308 = 0;
  local_4318 = "case0502";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_4310,&local_4318);
  local_2a60 = (_Any_data *)&local_140;
  local_4328 = case0503;
  local_4320 = 0;
  local_4330 = "case0503";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_4328,&local_4330);
  local_2a60 = (_Any_data *)&local_118;
  local_4340 = case0504;
  local_4338 = 0;
  local_4348 = "case0504";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_4340,&local_4348);
  local_2a60 = (_Any_data *)&local_f0;
  local_4358 = case0505;
  local_4350 = 0;
  local_4360 = "case0505";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_4358,&local_4360);
  local_2a60 = (_Any_data *)&local_c8;
  local_4370 = case0506;
  local_4368 = 0;
  local_4378 = "case0506";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_4370,&local_4378);
  local_2a60 = (_Any_data *)&local_a0;
  local_4388 = case0507;
  local_4380 = 0;
  local_4390 = "case0507";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_4388,&local_4390);
  local_2a60 = (_Any_data *)&local_78;
  local_43a0 = case0508;
  local_4398 = 0;
  local_43a8 = "case0508";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_43a0,&local_43a8);
  local_2a60 = (_Any_data *)&local_50;
  local_43b8 = case0509;
  local_43b0 = 0;
  local_43c0 = "case0509";
  std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::
  pair<void_(psy::C::SemanticModelTester::*)(),_true>
            ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_2a60,
             (offset_in_SemanticModelTester_to_subr *)&local_43b8,&local_43c0);
  local_28._M_unused._M_object = local_2a58;
  local_28._8_8_ = 0x10e;
  std::allocator<std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>_>::
  allocator(&local_43c1);
  __l._M_len = local_28._8_8_;
  __l._M_array = (iterator)local_28._M_unused._0_8_;
  std::
  vector<std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>,_std::allocator<std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>_>_>
  ::vector(&this->tests_,__l,&local_43c1);
  std::allocator<std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>_>::
  ~allocator(&local_43c1);
  local_43f8 = &local_28;
  do {
    local_43f8 = (_Any_data *)((long)local_43f8 + -0x28);
    std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::~pair
              ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_43f8
              );
  } while (local_43f8 != local_2a58);
  return;
}

Assistant:

SemanticModelTester(TestSuite* suite) : Tester(suite) {}